

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp analyze_app(sexp ctx,sexp x,int depth)

{
  sexp psVar1;
  bool bVar2;
  int unaff_retaddr;
  int unaff_retaddr_00;
  sexp tmp;
  sexp res;
  sexp p;
  sexp local_30;
  sexp local_20;
  
  psVar1 = analyze_list(res,tmp,unaff_retaddr_00,unaff_retaddr);
  if ((((psVar1->value).stack.length & 3) == 0) && (((psVar1->value).type.name)->tag == 0x1c)) {
    local_20 = (((psVar1->value).type.name)->value).type.cpl;
    local_30 = (psVar1->value).type.cpl;
    while( true ) {
      bVar2 = false;
      if (((((ulong)local_30 & 3) == 0) && (bVar2 = false, local_30->tag == 6)) &&
         (bVar2 = false, ((ulong)local_20 & 3) == 0)) {
        bVar2 = local_20->tag == 6;
      }
      if (!bVar2) break;
      if ((((local_30->value).stack.length & 3) == 0) &&
         (((local_30->value).type.name)->tag == 0x1c)) {
        (((local_30->value).type.name)->value).flonum = (local_20->value).flonum;
      }
      local_30 = (local_30->value).type.cpl;
      local_20 = (local_20->value).type.cpl;
    }
  }
  return psVar1;
}

Assistant:

static sexp analyze_app (sexp ctx, sexp x, int depth) {
  sexp p, res, tmp;
  res = analyze_list(ctx, x, depth, 0);
  if (sexp_lambdap(sexp_car(res))) {       /* fill in lambda names */
    p=sexp_lambda_params(sexp_car(res));
    for (tmp=sexp_cdr(res); sexp_pairp(tmp)&&sexp_pairp(p); tmp=sexp_cdr(tmp), p=sexp_cdr(p))
      if (sexp_lambdap(sexp_car(tmp)))
        sexp_lambda_name(sexp_car(tmp)) = sexp_car(p);
  }
  return res;
}